

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::HUF_DecompressFastArgs_init
                 (HUF_DecompressFastArgs *args,void *dst,size_t dstSize,void *src,size_t srcSize,
                 HUF_DTable *DTable)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  size_t sVar4;
  BYTE *pBVar5;
  byte bVar6;
  ulong uVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  size_t sVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  
  sVar10 = 0;
  if (0 < (long)dstSize) {
    sVar10 = dstSize;
  }
  if (dstSize == 0) {
    return 0;
  }
  if (srcSize < 10) {
    return 0xffffffffffffffec;
  }
  if ((*DTable & 0xff0000) == 0xb0000) {
    uVar3 = (ulong)*src;
    uVar11 = (ulong)*(ushort *)((long)src + 2);
    uVar7 = (ulong)*(ushort *)((long)src + 4);
    uVar12 = uVar3 + uVar11 + uVar7 + 6;
    args->iend[0] = (BYTE *)((long)src + 6);
    pBVar5 = (BYTE *)((long)src + uVar3 + 6);
    args->iend[1] = pBVar5;
    pBVar5 = pBVar5 + uVar11;
    args->iend[2] = pBVar5;
    pBVar8 = pBVar5 + uVar7;
    args->iend[3] = pBVar8;
    bVar13 = srcSize - uVar12 < 8;
    sVar4 = 0xffffffffffffffec;
    if (bVar13 || ((uVar11 < 8 || uVar3 < 8) || uVar7 < 8)) {
      sVar4 = 0;
    }
    if (bVar13 || ((uVar11 < 8 || uVar3 < 8) || uVar7 < 8)) {
      return sVar4;
    }
    if (srcSize < uVar12) {
      return sVar4;
    }
    args->ip[0] = (BYTE *)((long)src + (uVar3 - 2));
    args->ip[1] = pBVar5 + -8;
    args->ip[2] = pBVar8 + -8;
    args->ip[3] = (BYTE *)((long)src + (srcSize - 8));
    args->op[0] = (BYTE *)dst;
    uVar7 = dstSize + 3 >> 2;
    args->op[1] = (BYTE *)((long)dst + uVar7);
    pBVar9 = (BYTE *)((long)dst + uVar7) + uVar7;
    args->op[2] = pBVar9;
    args->op[3] = pBVar9 + uVar7;
    if (pBVar9 + uVar7 < (BYTE *)(sVar10 + (long)dst)) {
      bVar1 = *(byte *)((long)src + uVar3 + 5);
      iVar2 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar6 = ~(byte)iVar2 + 9;
      if (bVar1 == 0) {
        bVar6 = 0;
      }
      args->bits[0] = (*(ulong *)((long)src + (uVar3 - 2)) | 1) << (bVar6 & 0x3f);
      bVar1 = pBVar5[-1];
      iVar2 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar6 = ~(byte)iVar2 + 9;
      if (bVar1 == 0) {
        bVar6 = 0;
      }
      args->bits[1] = (*(ulong *)(pBVar5 + -8) | 1) << (bVar6 & 0x3f);
      bVar1 = pBVar8[-1];
      iVar2 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar6 = ~(byte)iVar2 + 9;
      if (bVar1 == 0) {
        bVar6 = 0;
      }
      args->bits[2] = (*(ulong *)(pBVar8 + -8) | 1) << (bVar6 & 0x3f);
      bVar1 = *(byte *)((long)src + (srcSize - 1));
      iVar2 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      bVar6 = ~(byte)iVar2 + 9;
      if (bVar1 == 0) {
        bVar6 = 0;
      }
      args->bits[3] = (*(ulong *)((long)src + (srcSize - 8)) | 1) << (bVar6 & 0x3f);
      args->ilowest = (BYTE *)src;
      args->oend = (BYTE *)(sVar10 + (long)dst);
      args->dt = DTable + 1;
      return 1;
    }
  }
  return 0;
}

Assistant:

static size_t HUF_DecompressFastArgs_init(HUF_DecompressFastArgs* args, void* dst, size_t dstSize, void const* src, size_t srcSize, const HUF_DTable* DTable)
{
    void const* dt = DTable + 1;
    U32 const dtLog = HUF_getDTableDesc(DTable).tableLog;

    const BYTE* const istart = (const BYTE*)src;

    BYTE* const oend = ZSTD_maybeNullPtrAdd((BYTE*)dst, dstSize);

    /* The fast decoding loop assumes 64-bit little-endian.
     * This condition is false on x32.
     */
    if (!MEM_isLittleEndian() || MEM_32bits())
        return 0;

    /* Avoid nullptr addition */
    if (dstSize == 0)
        return 0;
    assert(dst != NULL);

    /* strict minimum : jump table + 1 byte per stream */
    if (srcSize < 10)
        return ERROR(corruption_detected);

    /* Must have at least 8 bytes per stream because we don't handle initializing smaller bit containers.
     * If table log is not correct at this point, fallback to the old decoder.
     * On small inputs we don't have enough data to trigger the fast loop, so use the old decoder.
     */
    if (dtLog != HUF_DECODER_FAST_TABLELOG)
        return 0;

    /* Read the jump table. */
    {
        size_t const length1 = MEM_readLE16(istart);
        size_t const length2 = MEM_readLE16(istart+2);
        size_t const length3 = MEM_readLE16(istart+4);
        size_t const length4 = srcSize - (length1 + length2 + length3 + 6);
        args->iend[0] = istart + 6;  /* jumpTable */
        args->iend[1] = args->iend[0] + length1;
        args->iend[2] = args->iend[1] + length2;
        args->iend[3] = args->iend[2] + length3;

        /* HUF_initFastDStream() requires this, and this small of an input
         * won't benefit from the ASM loop anyways.
         */
        if (length1 < 8 || length2 < 8 || length3 < 8 || length4 < 8)
            return 0;
        if (length4 > srcSize) return ERROR(corruption_detected);   /* overflow */
    }
    /* ip[] contains the position that is currently loaded into bits[]. */
    args->ip[0] = args->iend[1] - sizeof(U64);
    args->ip[1] = args->iend[2] - sizeof(U64);
    args->ip[2] = args->iend[3] - sizeof(U64);
    args->ip[3] = (BYTE const*)src + srcSize - sizeof(U64);

    /* op[] contains the output pointers. */
    args->op[0] = (BYTE*)dst;
    args->op[1] = args->op[0] + (dstSize+3)/4;
    args->op[2] = args->op[1] + (dstSize+3)/4;
    args->op[3] = args->op[2] + (dstSize+3)/4;

    /* No point to call the ASM loop for tiny outputs. */
    if (args->op[3] >= oend)
        return 0;

    /* bits[] is the bit container.
        * It is read from the MSB down to the LSB.
        * It is shifted left as it is read, and zeros are
        * shifted in. After the lowest valid bit a 1 is
        * set, so that CountTrailingZeros(bits[]) can be used
        * to count how many bits we've consumed.
        */
    args->bits[0] = HUF_initFastDStream(args->ip[0]);
    args->bits[1] = HUF_initFastDStream(args->ip[1]);
    args->bits[2] = HUF_initFastDStream(args->ip[2]);
    args->bits[3] = HUF_initFastDStream(args->ip[3]);

    /* The decoders must be sure to never read beyond ilowest.
     * This is lower than iend[0], but allowing decoders to read
     * down to ilowest can allow an extra iteration or two in the
     * fast loop.
     */
    args->ilowest = istart;

    args->oend = oend;
    args->dt = dt;

    return 1;
}